

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O3

void __thiscall GenParser::visit(GenParser *this,Or *node)

{
  IRBuilder *this_00;
  BasicBlock *iffalse;
  Temp *target;
  string local_50;
  
  this_00 = &this->super_IRBuilder;
  iffalse = IR::IRBuilder::newBasicBlock(this_00);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  target = IR::IRBuilder::newTemp(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  IR::IRBuilder::save(this_00,target);
  CodeGenerator::condition
            (&this->super_CodeGenerator,(node->super_Pair).head,
             (this->super_CodeGenerator).code.iftrue,iffalse);
  IR::IRBuilder::place(this_00,iffalse);
  IR::IRBuilder::restore(this_00,target);
  CodeGenerator::condition
            (&this->super_CodeGenerator,(node->super_Pair).tail,
             (this->super_CodeGenerator).code.iftrue,(this->super_CodeGenerator).code.iffalse);
  return;
}

Assistant:

void GenParser::visit(ast::Or* node) {
  auto iffalse = newBasicBlock();
  auto target = newTemp();

  save(target);
  condition(node->head, code.iftrue, iffalse);
  place(iffalse);
  restore(target);
  condition(node->tail, code.iftrue, code.iffalse);
}